

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O0

string * __thiscall
upb::generator::PadPrefix_abi_cxx11_(string *__return_storage_ptr__,generator *this,string_view tag)

{
  string_view pc;
  bool bVar1;
  AlphaNum *b;
  AlphaNum local_98;
  AlphaNum local_68;
  byte local_22;
  allocator<char> local_21;
  undefined1 auStack_20 [8];
  string_view tag_local;
  
  b = (AlphaNum *)tag._M_str;
  tag_local._M_len = tag._M_len;
  auStack_20 = (undefined1  [8])this;
  tag_local._M_str = (char *)__return_storage_ptr__;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_20);
  local_22 = 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_22 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
  }
  else {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_68," ");
    pc._M_str = (char *)tag_local._M_len;
    pc._M_len = (size_t)auStack_20;
    absl::lts_20250127::AlphaNum::AlphaNum(&local_98,pc);
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_68,&local_98,b);
  }
  if ((local_22 & 1) != 0) {
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PadPrefix(absl::string_view tag) {
  return tag.empty() ? "" : absl::StrCat(" ", tag);
}